

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

void __thiscall QItemSelectionModel::setModel(QItemSelectionModel *this,QAbstractItemModel *model)

{
  QItemSelectionModelPrivate *this_00;
  
  this_00 = *(QItemSelectionModelPrivate **)(this + 8);
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::removeBindingUnlessInWrapper(&this_00->model);
  if ((this_00->model).super_QPropertyData<QAbstractItemModel_*>.val != model) {
    QItemSelectionModelPrivate::initModel(this_00,model);
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::notify(&this_00->model);
    return;
  }
  return;
}

Assistant:

void QItemSelectionModel::setModel(QAbstractItemModel *model)
{
    Q_D(QItemSelectionModel);
    d->model.removeBindingUnlessInWrapper();
    if (d->model.valueBypassingBindings() == model)
        return;
    d->initModel(model);
    d->model.notify();
}